

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetItemDefaultFocus(void)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImRect IVar4;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiScrollFlags in_stack_000000ac;
  ImRect *in_stack_000000b0;
  ImGuiWindow *in_stack_000000b8;
  ImRect *in_stack_ffffffffffffffd8;
  ImGuiWindow *in_stack_ffffffffffffffe0;
  ImVec2 local_18;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if (((((pIVar1->Appearing & 1U) != 0) && (GImGui->NavWindow == pIVar1->RootWindowForNav)) &&
      (((GImGui->NavInitRequest & 1U) != 0 || (GImGui->NavInitResultId != 0)))) &&
     (GImGui->NavLayer == (pIVar1->DC).NavLayerCurrent)) {
    GImGui->NavInitRequest = false;
    pIVar2->NavInitResultId = (pIVar2->LastItemData).ID;
    IVar4 = WindowRectAbsToRel(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    (pIVar2->NavInitResultRectRel).Min = IVar4.Min;
    local_18 = IVar4.Max;
    (pIVar2->NavInitResultRectRel).Max = local_18;
    NavUpdateAnyRequestFlag();
    bVar3 = IsItemVisible();
    if (!bVar3) {
      ScrollToRectEx(in_stack_000000b8,in_stack_000000b0,in_stack_000000ac);
    }
  }
  return;
}

Assistant:

void ImGui::SetItemDefaultFocus()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (!window->Appearing)
        return;
    if (g.NavWindow != window->RootWindowForNav || (!g.NavInitRequest && g.NavInitResultId == 0) || g.NavLayer != window->DC.NavLayerCurrent)
        return;

    g.NavInitRequest = false;
    g.NavInitResultId = g.LastItemData.ID;
    g.NavInitResultRectRel = WindowRectAbsToRel(window, g.LastItemData.Rect);
    NavUpdateAnyRequestFlag();

    // Scroll could be done in NavInitRequestApplyResult() via an opt-in flag (we however don't want regular init requests to scroll)
    if (!IsItemVisible())
        ScrollToRectEx(window, g.LastItemData.Rect, ImGuiScrollFlags_None);
}